

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O3

bool myutils::make_abs_dir(string *abs_path)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long *__command;
  bool bVar5;
  string cmd;
  stat s;
  long local_d8;
  long lStack_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  stat local_a8;
  
  iVar2 = stat((abs_path->_M_dataplus)._M_p,&local_a8);
  if (iVar2 == 0) {
    bVar5 = true;
  }
  else {
    pcVar1 = (abs_path->_M_dataplus)._M_p;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + abs_path->_M_string_length);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_c8,0,(char *)0x0,0x14ad48);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_d8 = *plVar4;
      lStack_d0 = plVar3[3];
      __command = &local_d8;
    }
    else {
      local_d8 = *plVar4;
      __command = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    iVar2 = system((char *)__command);
    bVar5 = iVar2 == 0;
    if (__command != &local_d8) {
      operator_delete(__command);
    }
  }
  return bVar5;
}

Assistant:

bool make_abs_dir(const std::string& abs_path)
    {
#ifdef _WIN32
        // if (!fs::exists(abs_path)) {
        //     return fs::create_directories(abs_path);
        // }
        // else {
        //     return true;
        // }
        DWORD attribs = ::GetFileAttributesA(abs_path.c_str());
        if (attribs == INVALID_FILE_ATTRIBUTES) {
            return CreateDirectoryA (abs_path.c_str(), NULL);
        }
        else {
            return (attribs & FILE_ATTRIBUTE_DIRECTORY);
        }
#else
        struct stat s;
        if (stat(abs_path.c_str(), &s) != 0) {
            std::string cmd = "mkdir -p " + string(abs_path);
            return system(cmd.c_str()) == 0;
        }
        else {
            return true;
        }
#endif
    }